

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx2check.cpp
# Opt level: O0

bool __thiscall ktxValidator::processOption(ktxValidator *this,argparser *parser,int opt)

{
  int iVar1;
  char *__nptr;
  int in_EDX;
  long in_RDI;
  
  if (in_EDX == 0x6d) {
    __nptr = (char *)std::__cxx11::string::c_str();
    iVar1 = atoi(__nptr);
    *(int *)(in_RDI + 0xf4) = iVar1;
  }
  else if (in_EDX == 0x71) {
    *(undefined1 *)(in_RDI + 0xf8) = 1;
  }
  else {
    if (in_EDX != 0x77) {
      return false;
    }
    *(undefined1 *)(in_RDI + 0xf9) = 1;
  }
  return true;
}

Assistant:

bool
ktxValidator::processOption(argparser& parser, int opt)
{
    switch (opt) {
      case 'q':
        options.quiet = true;
        break;
      case 'm':
        options.maxIssues = atoi(parser.optarg.c_str());
        break;
      case 'w':
        options.errorOnWarning = true;
        break;
      default:
        return false;
    }
    return true;
}